

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-maxpooling2d.cc
# Opt level: O3

Dim * __thiscall
dynet::MaxPooling2D::dim_forward
          (Dim *__return_storage_ptr__,MaxPooling2D *this,
          vector<dynet::Dim,_std::allocator<dynet::Dim>_> *xs)

{
  bool bVar1;
  uint b;
  pointer pDVar2;
  uint *puVar3;
  pointer puVar4;
  Dim *pDVar5;
  bool bVar6;
  pointer plVar7;
  invalid_argument *piVar8;
  bool bVar9;
  long lVar10;
  value_type_conflict5 *__val;
  float fVar11;
  ostringstream s;
  string local_1d8 [32];
  Dim *local_1b8;
  pointer local_1b0;
  vector<long,_std::allocator<long>_> local_1a8 [15];
  
  pDVar2 = (xs->super__Vector_base<dynet::Dim,_std::allocator<dynet::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(xs->super__Vector_base<dynet::Dim,_std::allocator<dynet::Dim>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pDVar2 != 0x24) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"MaxPooling2D requires exactly one input: ",0x29);
    operator<<((ostream *)local_1a8,xs);
    piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::invalid_argument::invalid_argument(piVar8,local_1d8);
    __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (pDVar2->nd == 3) {
    if ((this->is_valid == true) &&
       ((puVar3 = (this->ksize).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start, pDVar2->d[0] < *puVar3 ||
        (pDVar2->d[1] < puVar3[1])))) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "Bad input dimensions in MaxPooling2D:         in VALID mode, the kernel size cannot be greater than the feature map size"
                 ,0x78);
      operator<<((ostream *)local_1a8,xs);
      piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::invalid_argument::invalid_argument(piVar8,local_1d8);
      __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    b = pDVar2->bd;
    local_1b8 = __return_storage_ptr__;
    plVar7 = (pointer)operator_new(0x18);
    local_1a8[0].super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = plVar7 + 3;
    *plVar7 = 0;
    plVar7[1] = 0;
    plVar7[2] = 0;
    pDVar2 = (xs->super__Vector_base<dynet::Dim,_std::allocator<dynet::Dim>_>)._M_impl.
             super__Vector_impl_data._M_start;
    plVar7[2] = (ulong)pDVar2->d[2];
    local_1b0 = (this->ksize).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
    puVar4 = (this->stride).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    bVar1 = this->is_valid;
    lVar10 = 0;
    bVar6 = true;
    local_1a8[0].super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = plVar7;
    local_1a8[0].super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_1a8[0].super__Vector_base<long,_std::allocator<long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    do {
      bVar9 = bVar6;
      fVar11 = (float)pDVar2->d[lVar10];
      if (bVar1 != false) {
        fVar11 = (fVar11 - (float)local_1b0[lVar10]) + 1.0;
      }
      fVar11 = ceilf(fVar11 / (float)puVar4[lVar10]);
      pDVar5 = local_1b8;
      plVar7[lVar10] = (long)fVar11;
      lVar10 = 1;
      bVar6 = false;
    } while (bVar9);
    Dim::Dim(local_1b8,local_1a8,b);
    if (local_1a8[0].super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_1a8[0].super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return pDVar5;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Bad input dimensions in MaxPooling2D: ",0x26);
  operator<<((ostream *)local_1a8,xs);
  piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(piVar8,local_1d8);
  __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim MaxPooling2D::dim_forward(const vector<Dim>& xs) const {
  if (xs.size() != 1) {
    ostringstream s; s << "MaxPooling2D requires exactly one input: " << xs;
    throw std::invalid_argument(s.str());
  }
  if (xs[0].ndims() != 3) {
    ostringstream s; s << "Bad input dimensions in MaxPooling2D: " << xs;
    throw std::invalid_argument(s.str());
  }
  if (is_valid && (xs[0].d[0] < ksize[0] || xs[0].d[1] < ksize[1])) {
    ostringstream s; s << "Bad input dimensions in MaxPooling2D: \
        in VALID mode, the kernel size cannot be greater than the feature map size" << xs;
    throw std::invalid_argument(s.str());
  }
  unsigned bs = xs[0].batch_elems();
  std::vector<long> output_shape(3);
  output_shape[2] = static_cast<long>(xs[0].d[2]);
  for (unsigned i = 0; i < 2; ++i) {
    float input_dim = static_cast<float>(xs[0].d[i]);
    float kernel_dim = static_cast<float>(ksize[i]);
    float s = static_cast<float>(stride[i]);
    if (is_valid) {
      output_shape[i] = static_cast<long>(ceil((input_dim - kernel_dim + 1) / s));
    } else {
      output_shape[i] = static_cast<long>(ceil(input_dim / s));
    }
  }
  return Dim(output_shape, bs);
}